

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O1

string * __thiscall
duckdb::Blob::ToBase64_abi_cxx11_(string *__return_storage_ptr__,Blob *this,string_t blob)

{
  ulong __n;
  void *__s;
  char *output;
  ulong uVar1;
  string_t blob_00;
  
  output = (char *)0x5555555555555556;
  uVar1 = (((ulong)this & 0xffffffff) + 2) / 3;
  __n = uVar1 * 4;
  __s = operator_new__(__n);
  switchD_01306cb1::default(__s,0,__n);
  blob_00.value.pointer.ptr = (char *)__s;
  blob_00.value._0_8_ = blob.value._0_8_;
  ToBase64(this,blob_00,output);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__s,(void *)((long)__s + uVar1 * 4));
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

string Blob::ToBase64(string_t blob) {
	auto base64_size = Blob::ToBase64Size(blob);
	auto data = make_uniq_array<char>(base64_size);
	Blob::ToBase64(blob, data.get());
	return string(data.get(), base64_size);
}